

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O0

double __thiscall ON_EarthAnchorPoint::KMLOrientationHeadingAngleDegrees(ON_EarthAnchorPoint *this)

{
  bool bVar1;
  double local_38;
  double dStack_28;
  bool rc;
  double roll_degrees;
  double tilt_degrees;
  double heading_degrees;
  ON_EarthAnchorPoint *this_local;
  
  tilt_degrees = ON_DBL_QNAN;
  roll_degrees = ON_DBL_QNAN;
  dStack_28 = ON_DBL_QNAN;
  heading_degrees = (double)this;
  bVar1 = GetKMLOrientationAnglesDegrees(this,&tilt_degrees,&roll_degrees,&stack0xffffffffffffffd8);
  if (bVar1) {
    local_38 = tilt_degrees;
  }
  else {
    local_38 = ON_DBL_QNAN;
  }
  return local_38;
}

Assistant:

const double ON_EarthAnchorPoint::KMLOrientationHeadingAngleDegrees() const
{
  double heading_degrees = ON_DBL_QNAN;
  double tilt_degrees = ON_DBL_QNAN;
  double roll_degrees = ON_DBL_QNAN;
  const bool rc = GetKMLOrientationAnglesDegrees(heading_degrees, tilt_degrees, roll_degrees);
  return rc ? heading_degrees : ON_DBL_QNAN;
}